

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.cpp
# Opt level: O0

void __thiscall
Nova::Triangulated_Surface<float>::Initialize_Box_Tessellation
          (Triangulated_Surface<float> *this,Box<float,_3> *box)

{
  initializer_list<int> l;
  initializer_list<int> l_00;
  initializer_list<int> l_01;
  initializer_list<int> l_02;
  initializer_list<int> l_03;
  initializer_list<int> l_04;
  initializer_list<int> l_05;
  initializer_list<int> l_06;
  initializer_list<int> l_07;
  initializer_list<int> l_08;
  initializer_list<int> l_09;
  initializer_list<int> l_10;
  initializer_list<float> l_11;
  initializer_list<float> l_12;
  initializer_list<float> l_13;
  initializer_list<float> l_14;
  initializer_list<float> l_15;
  initializer_list<float> l_16;
  initializer_list<float> l_17;
  initializer_list<float> l_18;
  float *pfVar1;
  size_t sVar2;
  int local_33c [3];
  iterator local_330;
  undefined8 local_328;
  Vector<int,_3,_true> local_320;
  int local_314 [3];
  iterator local_308;
  undefined8 local_300;
  Vector<int,_3,_true> local_2f8;
  int local_2ec [3];
  iterator local_2e0;
  undefined8 local_2d8;
  Vector<int,_3,_true> local_2d0;
  int local_2c4 [3];
  iterator local_2b8;
  undefined8 local_2b0;
  Vector<int,_3,_true> local_2a8;
  int local_29c [3];
  iterator local_290;
  undefined8 local_288;
  Vector<int,_3,_true> local_280;
  int local_274 [3];
  iterator local_268;
  undefined8 local_260;
  Vector<int,_3,_true> local_258;
  int local_24c [3];
  iterator local_240;
  undefined8 local_238;
  Vector<int,_3,_true> local_230;
  int local_224 [3];
  iterator local_218;
  undefined8 local_210;
  Vector<int,_3,_true> local_208;
  int local_1fc [3];
  iterator local_1f0;
  undefined8 local_1e8;
  Vector<int,_3,_true> local_1e0;
  int local_1d4 [3];
  iterator local_1c8;
  undefined8 local_1c0;
  Vector<int,_3,_true> local_1b8;
  int local_1ac [3];
  iterator local_1a0;
  undefined8 local_198;
  Vector<int,_3,_true> local_190;
  int local_184 [3];
  iterator local_178;
  undefined8 local_170;
  Vector<int,_3,_true> local_168;
  float local_15c;
  float local_158;
  float local_154;
  iterator local_150;
  undefined8 local_148;
  Vector<float,_3,_true> local_140;
  float local_134;
  float local_130;
  float local_12c;
  iterator local_128;
  undefined8 local_120;
  Vector<float,_3,_true> local_118;
  float local_10c;
  float local_108;
  float local_104;
  iterator local_100;
  undefined8 local_f8;
  Vector<float,_3,_true> local_f0;
  float local_e4;
  float local_e0;
  float local_dc;
  iterator local_d8;
  undefined8 local_d0;
  Vector<float,_3,_true> local_c8;
  float local_bc;
  float local_b8;
  float local_b4;
  iterator local_b0;
  undefined8 local_a8;
  Vector<float,_3,_true> local_a0;
  float local_94;
  float local_90;
  float local_8c;
  iterator local_88;
  undefined8 local_80;
  Vector<float,_3,_true> local_78;
  float local_6c;
  float local_68;
  float local_64;
  iterator local_60;
  undefined8 local_58;
  Vector<float,_3,_true> local_50;
  float local_44;
  float local_40;
  float local_3c;
  iterator local_38;
  undefined8 local_30;
  Vector<float,_3,_true> local_24;
  Box<float,_3> *local_18;
  Box<float,_3> *box_local;
  Triangulated_Surface<float> *this_local;
  
  local_18 = box;
  box_local = (Box<float,_3> *)this;
  Array<Nova::Vector<float,_3,_true>_>::Clear((Array<Nova::Vector<float,_3,_true>_> *)this);
  Array<Nova::Vector<int,_3,_true>_>::Clear(&(this->super_Simplex_Mesh<3>).elements);
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,0);
  local_44 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,1);
  local_40 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,2);
  local_3c = *pfVar1;
  local_38 = &local_44;
  local_30 = 3;
  l_18._M_len = 3;
  l_18._M_array = local_38;
  Vector<float,_3,_true>::Vector(&local_24,l_18);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_24);
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,0);
  local_6c = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,1);
  local_68 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,2);
  local_64 = *pfVar1;
  local_60 = &local_6c;
  local_58 = 3;
  l_17._M_len = 3;
  l_17._M_array = local_60;
  Vector<float,_3,_true>::Vector(&local_50,l_17);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_50);
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,0);
  local_94 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,1);
  local_90 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,2);
  local_8c = *pfVar1;
  local_88 = &local_94;
  local_80 = 3;
  l_16._M_len = 3;
  l_16._M_array = local_88;
  Vector<float,_3,_true>::Vector(&local_78,l_16);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_78);
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,0);
  local_bc = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,1);
  local_b8 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,2);
  local_b4 = *pfVar1;
  local_b0 = &local_bc;
  local_a8 = 3;
  l_15._M_len = 3;
  l_15._M_array = local_b0;
  Vector<float,_3,_true>::Vector(&local_a0,l_15);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_a0);
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,0);
  local_e4 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,1);
  local_e0 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,2);
  local_dc = *pfVar1;
  local_d8 = &local_e4;
  local_d0 = 3;
  l_14._M_len = 3;
  l_14._M_array = local_d8;
  Vector<float,_3,_true>::Vector(&local_c8,l_14);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_c8);
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,0);
  local_10c = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,1);
  local_108 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,2);
  local_104 = *pfVar1;
  local_100 = &local_10c;
  local_f8 = 3;
  l_13._M_len = 3;
  l_13._M_array = local_100;
  Vector<float,_3,_true>::Vector(&local_f0,l_13);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_f0);
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,0);
  local_134 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,1);
  local_130 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,2);
  local_12c = *pfVar1;
  local_128 = &local_134;
  local_120 = 3;
  l_12._M_len = 3;
  l_12._M_array = local_128;
  Vector<float,_3,_true>::Vector(&local_118,l_12);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_118);
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,0);
  local_15c = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[](&(local_18->super_Range<float,_3>).max_corner,1);
  local_158 = *pfVar1;
  pfVar1 = Vector<float,_3,_true>::operator[]((Vector<float,_3,_true> *)local_18,2);
  local_154 = *pfVar1;
  local_150 = &local_15c;
  local_148 = 3;
  l_11._M_len = 3;
  l_11._M_array = local_150;
  Vector<float,_3,_true>::Vector(&local_140,l_11);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_140);
  local_184[0] = 0;
  local_184[1] = 3;
  local_184[2] = 7;
  local_178 = local_184;
  local_170 = 3;
  l_10._M_len = 3;
  l_10._M_array = local_178;
  Vector<int,_3,_true>::Vector(&local_168,l_10);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_168);
  local_1ac[0] = 7;
  local_1ac[1] = 4;
  local_1ac[2] = 0;
  local_1a0 = local_1ac;
  local_198 = 3;
  l_09._M_len = 3;
  l_09._M_array = local_1a0;
  Vector<int,_3,_true>::Vector(&local_190,l_09);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_190);
  local_1d4[0] = 1;
  local_1d4[1] = 5;
  local_1d4[2] = 6;
  local_1c8 = local_1d4;
  local_1c0 = 3;
  l_08._M_len = 3;
  l_08._M_array = local_1c8;
  Vector<int,_3,_true>::Vector(&local_1b8,l_08);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_1b8);
  local_1fc[0] = 6;
  local_1fc[1] = 2;
  local_1fc[2] = 1;
  local_1f0 = local_1fc;
  local_1e8 = 3;
  l_07._M_len = 3;
  l_07._M_array = local_1f0;
  Vector<int,_3,_true>::Vector(&local_1e0,l_07);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_1e0);
  local_224[0] = 4;
  local_224[1] = 1;
  local_224[2] = 0;
  local_218 = local_224;
  local_210 = 3;
  l_06._M_len = 3;
  l_06._M_array = local_218;
  Vector<int,_3,_true>::Vector(&local_208,l_06);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_208);
  local_24c[0] = 1;
  local_24c[1] = 4;
  local_24c[2] = 5;
  local_240 = local_24c;
  local_238 = 3;
  l_05._M_len = 3;
  l_05._M_array = local_240;
  Vector<int,_3,_true>::Vector(&local_230,l_05);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_230);
  local_274[0] = 6;
  local_274[1] = 7;
  local_274[2] = 2;
  local_268 = local_274;
  local_260 = 3;
  l_04._M_len = 3;
  l_04._M_array = local_268;
  Vector<int,_3,_true>::Vector(&local_258,l_04);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_258);
  local_29c[0] = 3;
  local_29c[1] = 2;
  local_29c[2] = 7;
  local_290 = local_29c;
  local_288 = 3;
  l_03._M_len = 3;
  l_03._M_array = local_290;
  Vector<int,_3,_true>::Vector(&local_280,l_03);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_280);
  local_2c4[0] = 4;
  local_2c4[1] = 7;
  local_2c4[2] = 6;
  local_2b8 = local_2c4;
  local_2b0 = 3;
  l_02._M_len = 3;
  l_02._M_array = local_2b8;
  Vector<int,_3,_true>::Vector(&local_2a8,l_02);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_2a8);
  local_2ec[0] = 6;
  local_2ec[1] = 5;
  local_2ec[2] = 4;
  local_2e0 = local_2ec;
  local_2d8 = 3;
  l_01._M_len = 3;
  l_01._M_array = local_2e0;
  Vector<int,_3,_true>::Vector(&local_2d0,l_01);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_2d0);
  local_314[0] = 0;
  local_314[1] = 1;
  local_314[2] = 2;
  local_308 = local_314;
  local_300 = 3;
  l_00._M_len = 3;
  l_00._M_array = local_308;
  Vector<int,_3,_true>::Vector(&local_2f8,l_00);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_2f8);
  local_33c[0] = 0;
  local_33c[1] = 2;
  local_33c[2] = 3;
  local_330 = local_33c;
  local_328 = 3;
  l._M_len = 3;
  l._M_array = local_330;
  Vector<int,_3,_true>::Vector(&local_320,l);
  Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_320);
  sVar2 = Array<Nova::Vector<float,_3,_true>_>::size((Array<Nova::Vector<float,_3,_true>_> *)this);
  (this->super_Simplex_Mesh<3>).number_of_nodes = sVar2;
  return;
}

Assistant:

void Nova::Triangulated_Surface<T>::
Initialize_Box_Tessellation(const Box<T,d>& box)
{
    points.Clear();elements.Clear();

    Add_Vertex(TV({box.min_corner[0],box.min_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.min_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.max_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.min_corner[0],box.max_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.min_corner[0],box.min_corner[1],box.min_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.min_corner[1],box.min_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.max_corner[1],box.min_corner[2]}));
    Add_Vertex(TV({box.min_corner[0],box.max_corner[1],box.min_corner[2]}));

    Add_Element(INDEX({0,3,7}));
    Add_Element(INDEX({7,4,0}));
    Add_Element(INDEX({1,5,6}));
    Add_Element(INDEX({6,2,1}));
    Add_Element(INDEX({4,1,0}));
    Add_Element(INDEX({1,4,5}));
    Add_Element(INDEX({6,7,2}));
    Add_Element(INDEX({3,2,7}));
    Add_Element(INDEX({4,7,6}));
    Add_Element(INDEX({6,5,4}));
    Add_Element(INDEX({0,1,2}));
    Add_Element(INDEX({0,2,3}));
    number_of_nodes=points.size();
}